

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::BuildHandlerScope
               (Var argThis,RecyclableObject *hostObject,FrameDisplay *pDisplay,
               ScriptContext *scriptContext)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  BOOL BVar5;
  JavascriptNumberObject *item;
  undefined4 *puVar6;
  undefined4 extraout_var;
  Recycler *this;
  FrameDisplay *pFVar7;
  Var pvVar8;
  ushort uVar9;
  ushort uVar10;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  pvVar8 = argThis;
  if (argThis == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b5e,"(argThis != nullptr)","argThis != nullptr");
    if (!bVar3) goto LAB_00ab8387;
    *puVar6 = 0;
    pvVar8 = (Var)0x0;
  }
  bVar3 = VarIs<Js::RecyclableObject>(pvVar8);
  if (bVar3) {
    item = (JavascriptNumberObject *)ToUnscopablesWrapperObject(argThis,scriptContext);
  }
  else {
    item = JavascriptLibrary::CreateNumberObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,argThis);
  }
  FrameDisplay::SetItem(pDisplay,0,item);
  if (argThis == (Var)0x0) {
    uVar9 = 1;
  }
  else {
    uVar10 = pDisplay->length;
    uVar9 = 9;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      iVar4 = (*(hostObject->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x4e])(hostObject,argThis);
      if ((Var)CONCAT44(extraout_var,iVar4) == (Var)0x0) break;
      uVar1 = uVar9 - 8;
      data._32_8_ = CrossSite::MarshalVar(scriptContext,(Var)CONCAT44(extraout_var,iVar4),false);
      if (uVar1 == uVar10) {
        if (0xfff7 < uVar1) {
          ::Math::DefaultOverflowPolicy();
        }
        local_80 = (undefined1  [8])&FrameDisplay::typeinfo;
        data.plusSize = 0xffffffffffffffff;
        data.count = (size_t)anon_var_dwarf_4e91f59;
        data.filename._0_4_ = 0x1b73;
        data.typeinfo = (type_info *)((ulong)uVar9 * 8);
        this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_80);
        BVar5 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar5 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00ab8387;
          *puVar6 = 0;
        }
        pFVar7 = (FrameDisplay *)
                 Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                           (this,(size_t)((type_info *)((ulong)uVar9 * 8) + 8));
        if (pFVar7 == (FrameDisplay *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x20d,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) goto LAB_00ab8387;
          *puVar6 = 0;
        }
        pFVar7->tag = true;
        pFVar7->strictMode = false;
        pFVar7->length = uVar9;
        pFVar7->unused = 0;
        js_memcpy_s(pFVar7 + 1,(ulong)pFVar7->length << 3,pDisplay + 1,(ulong)pDisplay->length << 3)
        ;
        pDisplay = pFVar7;
        uVar10 = uVar9;
      }
      argThis = (Var)data._32_8_;
      pvVar8 = ToUnscopablesWrapperObject((Var)data._32_8_,scriptContext);
      FrameDisplay::SetItem(pDisplay,(uint)uVar1,pvVar8);
      uVar9 = uVar9 + 1;
    } while (argThis != (Var)0x0);
    uVar9 = uVar9 - 8;
  }
  if (pDisplay->length < uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1b7f,"(i <= pDisplay->GetLength())","i <= pDisplay->GetLength()")
    ;
    if (!bVar3) {
LAB_00ab8387:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pDisplay->length = uVar9;
  return;
}

Assistant:

void JavascriptOperators::BuildHandlerScope(Var argThis, RecyclableObject * hostObject, FrameDisplay * pDisplay, ScriptContext * scriptContext)
    {
        // Event handlers need implicit lookups of @@unscopables on parent scopes.
        // We can intercept the property accesses by wrapping the object with the unscopables handler.
        // WebIDL: https://heycam.github.io/webidl/#ref-for-Unscopable

        Assert(argThis != nullptr);
        pDisplay->SetItem(0, TaggedNumber::Is(argThis) ? scriptContext->GetLibrary()->CreateNumberObject(argThis) : ToUnscopablesWrapperObject(argThis, scriptContext));
        uint16 i = 1;

        Var aChild = argThis;
        uint16 length = pDisplay->GetLength();

        // Now add any parent scopes
        // We need to support the namespace parent lookup in both fastDOM on and off scenario.
        while (aChild != NULL)
        {
            Var aParent = hostObject->GetNamespaceParent(aChild);

            if (aParent == nullptr)
            {
                break;
            }
            aParent = CrossSite::MarshalVar(scriptContext, aParent);
            if (i == length)
            {
                length = UInt16Math::Add(length, 8);
                FrameDisplay * tmp = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
                js_memcpy_s((char*)tmp + tmp->GetOffsetOfScopes(), tmp->GetLength() * sizeof(void *), (char*)pDisplay + pDisplay->GetOffsetOfScopes(), pDisplay->GetLength() * sizeof(void*));
                pDisplay = tmp;
            }

            Var aParentWrapped = ToUnscopablesWrapperObject(aParent, scriptContext);
            pDisplay->SetItem(i, aParentWrapped);

            aChild = aParent;
            i++;
        }

        Assert(i <= pDisplay->GetLength());
        pDisplay->SetLength(i);
    }